

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O2

GENERAL_NAMES *
v2i_GENERAL_NAMES(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  OPENSSL_STACK *sk;
  size_t sVar1;
  CONF_VALUE *cnf;
  GENERAL_NAME *a;
  size_t i;
  ulong i_00;
  
  sk = OPENSSL_sk_new_null();
  if (sk != (OPENSSL_STACK *)0x0) {
    i_00 = 0;
    do {
      sVar1 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
      if (sVar1 <= i_00) {
        return (GENERAL_NAMES *)sk;
      }
      cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,i_00);
      a = v2i_GENERAL_NAME(method,ctx,cnf);
      if (a == (GENERAL_NAME *)0x0) break;
      sVar1 = OPENSSL_sk_push(sk,a);
      i_00 = i_00 + 1;
    } while (sVar1 != 0);
    GENERAL_NAME_free(a);
    sk_GENERAL_NAME_pop_free((stack_st_GENERAL_NAME *)sk,GENERAL_NAME_free);
  }
  return (GENERAL_NAMES *)0x0;
}

Assistant:

GENERAL_NAMES *v2i_GENERAL_NAMES(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *nval) {
  GENERAL_NAMES *gens = sk_GENERAL_NAME_new_null();
  if (gens == NULL) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    GENERAL_NAME *gen = v2i_GENERAL_NAME(method, ctx, cnf);
    if (gen == NULL || !sk_GENERAL_NAME_push(gens, gen)) {
      GENERAL_NAME_free(gen);
      goto err;
    }
  }
  return gens;
err:
  sk_GENERAL_NAME_pop_free(gens, GENERAL_NAME_free);
  return NULL;
}